

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update3sparse
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int *rn,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          eps2,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec2,int *idx2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int *rn2,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          eps3,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec3,int *idx3,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs3,int *ridx3,int *rn3,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  undefined8 *puVar1;
  uint *puVar2;
  bool bVar3;
  fpclass_type fVar4;
  int iVar5;
  int *piVar6;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *vec_00;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined4 uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  uint local_524;
  cpp_dec_float<100U,_int,_void> local_508;
  int32_t local_4b0;
  int local_4ac;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  int *local_468;
  int *local_460;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_458;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_450;
  cpp_dec_float<100U,_int,_void> local_448;
  cpp_dec_float<100U,_int,_void> local_3f8;
  cpp_dec_float<100U,_int,_void> local_3a8;
  cpp_dec_float<100U,_int,_void> local_358;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  local_88.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_88.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_88.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_88.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_88.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_88.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
  local_88.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
  local_88.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
  local_88.m_backend.exp = (eps->m_backend).exp;
  local_88.m_backend.neg = (eps->m_backend).neg;
  local_88.m_backend.fpclass = (eps->m_backend).fpclass;
  local_88.m_backend.prec_elem = (eps->m_backend).prec_elem;
  local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_d8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_d8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_d8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_d8.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_d8.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  local_d8.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x38);
  local_d8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x40);
  local_d8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x44);
  local_d8.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x48);
  local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._48_8_;
  local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 8)
  ;
  local_128.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x10);
  local_128.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x18);
  local_128.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x20);
  local_128.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x28);
  local_128.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x30);
  local_128.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x38);
  local_128.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._48_8_ + 0x40);
  local_128.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._48_8_ + 0x44);
  local_128.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x48);
  local_458 = vec;
  vSolveLright3(this,rhs,ridx,rn,&local_88,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._24_8_,(int *)eps2.m_backend.data._M_elems._32_8_,
                (int *)eps2.m_backend.data._M_elems._40_8_,&local_d8,
                (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend._72_8_,(int *)vec2,idx2,&local_128);
  local_478 = 0;
  uStack_470 = 0;
  local_488 = 0;
  uStack_480 = 0;
  local_498 = 0;
  uStack_490 = 0;
  local_4a8 = 0;
  uStack_4a0 = 0;
  piVar6 = (this->row).perm;
  local_468 = idx;
  local_450 = this;
  if (rhs2 == (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)0x0) {
    if (*rn < 1) {
      iVar8 = 0;
    }
    else {
      lVar14 = 0;
      uVar15 = 0;
      do {
        uVar12 = (uint)uVar15;
        iVar8 = ridx[lVar14];
        local_4a8 = *(undefined8 *)rhs[iVar8].m_backend.data._M_elems;
        uStack_4a0 = *(undefined8 *)(rhs[iVar8].m_backend.data._M_elems + 2);
        puVar2 = rhs[iVar8].m_backend.data._M_elems + 4;
        local_498 = *(undefined8 *)puVar2;
        uStack_490 = *(undefined8 *)(puVar2 + 2);
        puVar2 = rhs[iVar8].m_backend.data._M_elems + 8;
        local_488 = *(undefined8 *)puVar2;
        uStack_480 = *(undefined8 *)(puVar2 + 2);
        puVar2 = rhs[iVar8].m_backend.data._M_elems + 0xc;
        local_478 = *(undefined8 *)puVar2;
        uStack_470 = *(undefined8 *)(puVar2 + 2);
        local_508.exp = rhs[iVar8].m_backend.exp;
        local_508.neg = rhs[iVar8].m_backend.neg;
        local_508.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar8].m_backend.data._M_elems;
        local_508.data._M_elems._8_8_ = *(undefined8 *)(rhs[iVar8].m_backend.data._M_elems + 2);
        puVar2 = rhs[iVar8].m_backend.data._M_elems + 4;
        local_508.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_508.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = rhs[iVar8].m_backend.data._M_elems + 8;
        local_508.data._M_elems._32_8_ = *(undefined8 *)puVar2;
        local_508.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = rhs[iVar8].m_backend.data._M_elems + 0xc;
        local_508.data._M_elems._48_8_ = *(undefined8 *)puVar2;
        local_508.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
        local_508.fpclass = rhs[iVar8].m_backend.fpclass;
        local_508.prec_elem = rhs[iVar8].m_backend.prec_elem;
        local_3a8.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_3a8.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_3a8.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_3a8.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_3a8.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_3a8.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_3a8.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_3a8.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_3a8.exp = (eps->m_backend).exp;
        local_3a8.neg = (eps->m_backend).neg;
        local_3a8.fpclass = (eps->m_backend).fpclass;
        local_3a8.prec_elem = (eps->m_backend).prec_elem;
        if ((local_508.neg == true) &&
           (local_508.data._M_elems[0] != 0 || local_508.fpclass != cpp_dec_float_finite)) {
          local_508.neg = false;
        }
        if ((local_3a8.fpclass == cpp_dec_float_NaN || local_508.fpclass == cpp_dec_float_NaN) ||
           (iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              (&local_508,&local_3a8), iVar7 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (&rhs[iVar8].m_backend,0);
        }
        else {
          iVar8 = piVar6[iVar8];
          uVar9 = uVar12;
          if (0 < (int)uVar12) {
            do {
              uVar17 = (uint)uVar15 - 1;
              uVar10 = uVar17 >> 1;
              uVar9 = (uint)uVar15;
              if (iVar8 <= ridx[uVar10]) break;
              ridx[uVar15] = ridx[uVar10];
              uVar15 = (ulong)uVar10;
              uVar9 = uVar10;
            } while (1 < uVar17);
          }
          uVar15 = (ulong)(uVar12 + 1);
          ridx[(int)uVar9] = iVar8;
        }
        iVar8 = (int)uVar15;
        lVar14 = lVar14 + 1;
      } while (lVar14 < *rn);
    }
    *rn = iVar8;
  }
  else {
    if (*rn < 1) {
      local_524 = 0;
    }
    else {
      local_460 = rn2;
      lVar14 = 0;
      local_524 = 0;
      do {
        iVar8 = ridx[lVar14];
        local_4a8 = *(undefined8 *)rhs[iVar8].m_backend.data._M_elems;
        uStack_4a0 = *(undefined8 *)(rhs[iVar8].m_backend.data._M_elems + 2);
        puVar2 = rhs[iVar8].m_backend.data._M_elems + 4;
        local_498 = *(undefined8 *)puVar2;
        uStack_490 = *(undefined8 *)(puVar2 + 2);
        puVar2 = rhs[iVar8].m_backend.data._M_elems + 8;
        local_488 = *(undefined8 *)puVar2;
        uStack_480 = *(undefined8 *)(puVar2 + 2);
        puVar2 = rhs[iVar8].m_backend.data._M_elems + 0xc;
        local_478 = *(undefined8 *)puVar2;
        uStack_470 = *(undefined8 *)(puVar2 + 2);
        local_508.exp = rhs[iVar8].m_backend.exp;
        bVar3 = rhs[iVar8].m_backend.neg;
        fVar4 = rhs[iVar8].m_backend.fpclass;
        local_508.prec_elem = rhs[iVar8].m_backend.prec_elem;
        local_508.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar8].m_backend.data._M_elems;
        local_508.data._M_elems._8_8_ = *(undefined8 *)(rhs[iVar8].m_backend.data._M_elems + 2);
        puVar2 = rhs[iVar8].m_backend.data._M_elems + 4;
        local_508.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_508.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = rhs[iVar8].m_backend.data._M_elems + 8;
        local_508.data._M_elems._32_8_ = *(undefined8 *)puVar2;
        local_508.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = rhs[iVar8].m_backend.data._M_elems + 0xc;
        local_508.data._M_elems._48_8_ = *(undefined8 *)puVar2;
        local_508.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
        local_358.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_358.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
        local_358.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_358.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_358.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_358.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
        local_358.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
        local_358.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
        local_358.exp = (eps->m_backend).exp;
        local_358.neg = (eps->m_backend).neg;
        local_358.fpclass = (eps->m_backend).fpclass;
        local_358.prec_elem = (eps->m_backend).prec_elem;
        local_508.fpclass = fVar4;
        local_508.neg = bVar3;
        if ((bVar3 == true) && (local_508.data._M_elems[0] != 0 || fVar4 != cpp_dec_float_finite)) {
          local_508.neg = false;
        }
        if ((local_358.fpclass == cpp_dec_float_NaN || fVar4 == cpp_dec_float_NaN) ||
           (local_4b0 = local_508.prec_elem, local_4ac = local_508.exp,
           iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                             (&local_508,&local_358), iVar7 < 1)) {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                    (&rhs[iVar8].m_backend,0);
        }
        else {
          *local_460 = iVar8;
          iVar7 = piVar6[iVar8];
          uVar12 = local_524;
          if (0 < (int)local_524) {
            do {
              uVar9 = uVar12 - 1;
              uVar10 = uVar9 >> 1;
              if (iVar7 <= ridx[uVar10]) break;
              ridx[uVar12] = ridx[uVar10];
              uVar12 = uVar10;
            } while (1 < uVar9);
          }
          local_460 = local_460 + 1;
          local_524 = local_524 + 1;
          ridx[(int)uVar12] = iVar7;
          puVar2 = rhs2[iVar8].m_backend.data._M_elems + 0xc;
          *(undefined8 *)puVar2 = local_478;
          *(undefined8 *)(puVar2 + 2) = uStack_470;
          puVar2 = rhs2[iVar8].m_backend.data._M_elems + 8;
          *(undefined8 *)puVar2 = local_488;
          *(undefined8 *)(puVar2 + 2) = uStack_480;
          puVar2 = rhs2[iVar8].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar2 = local_498;
          *(undefined8 *)(puVar2 + 2) = uStack_490;
          *(undefined8 *)rhs2[iVar8].m_backend.data._M_elems = local_4a8;
          *(undefined8 *)(rhs2[iVar8].m_backend.data._M_elems + 2) = uStack_4a0;
          rhs2[iVar8].m_backend.exp = local_4ac;
          rhs2[iVar8].m_backend.neg = bVar3;
          rhs2[iVar8].m_backend.fpclass = fVar4;
          rhs2[iVar8].m_backend.prec_elem = local_4b0;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < *rn);
    }
    *rn = local_524;
    *ridx2 = local_524;
  }
  iVar8 = 0;
  uVar13 = 0;
  if (0 < *(int *)eps2.m_backend.data._M_elems._40_8_) {
    lVar14 = 0;
    uVar15 = 0;
    do {
      uVar12 = (uint)uVar15;
      lVar19 = (long)*(int *)(eps2.m_backend.data._M_elems._32_8_ + lVar14 * 4);
      lVar16 = lVar19 * 0x50;
      local_4a8 = *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + lVar16);
      uStack_4a0 = ((undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + lVar16))[1];
      puVar1 = (undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + 0x10 + lVar16);
      local_498 = *puVar1;
      uStack_490 = puVar1[1];
      puVar1 = (undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + 0x20 + lVar16);
      local_488 = *puVar1;
      uStack_480 = puVar1[1];
      puVar1 = (undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + 0x30 + lVar16);
      local_478 = *puVar1;
      uStack_470 = puVar1[1];
      local_508.exp = *(int *)(eps2.m_backend.data._M_elems._24_8_ + 0x40 + lVar16);
      local_508.neg = *(bool *)(eps2.m_backend.data._M_elems._24_8_ + 0x44 + lVar16);
      local_508.data._M_elems._0_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + lVar16);
      local_508.data._M_elems._8_8_ =
           *(undefined8 *)((uint *)(eps2.m_backend.data._M_elems._24_8_ + lVar16) + 2);
      puVar2 = (uint *)(eps2.m_backend.data._M_elems._24_8_ + 0x10 + lVar16);
      local_508.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_508.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)(eps2.m_backend.data._M_elems._24_8_ + 0x20 + lVar16);
      local_508.data._M_elems._32_8_ = *(undefined8 *)puVar2;
      local_508.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)(eps2.m_backend.data._M_elems._24_8_ + 0x30 + lVar16);
      local_508.data._M_elems._48_8_ = *(undefined8 *)puVar2;
      local_508.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
      local_508._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._24_8_ + 0x48 + lVar16);
      local_3f8.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
      local_3f8.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
      local_3f8.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
      local_3f8.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
      local_3f8.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
      local_3f8.data._M_elems._40_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
      local_3f8.data._M_elems._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
      local_3f8.data._M_elems._56_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x38);
      local_3f8.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x40);
      local_3f8.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x44);
      local_3f8._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x48);
      if ((local_508.neg == true) &&
         (local_508.data._M_elems[0] != 0 || local_508.fpclass != cpp_dec_float_finite)) {
        local_508.neg = false;
      }
      if ((local_3f8.fpclass == cpp_dec_float_NaN || local_508.fpclass == cpp_dec_float_NaN) ||
         (iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&local_508,&local_3f8), iVar7 < 1)) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)(lVar16 + eps2.m_backend.data._M_elems._24_8_),
                   0);
      }
      else {
        iVar7 = piVar6[lVar19];
        uVar9 = uVar12;
        if (0 < (int)uVar12) {
          do {
            uVar17 = (uint)uVar15 - 1;
            uVar10 = uVar17 >> 1;
            iVar5 = *(int *)(eps2.m_backend.data._M_elems._32_8_ + (ulong)uVar10 * 4);
            uVar9 = (uint)uVar15;
            if (iVar7 <= iVar5) break;
            *(int *)(eps2.m_backend.data._M_elems._32_8_ + uVar15 * 4) = iVar5;
            uVar15 = (ulong)uVar10;
            uVar9 = uVar10;
          } while (1 < uVar17);
        }
        uVar15 = (ulong)(uVar12 + 1);
        *(int *)(eps2.m_backend.data._M_elems._32_8_ + (long)(int)uVar9 * 4) = iVar7;
      }
      uVar13 = (undefined4)uVar15;
      lVar14 = lVar14 + 1;
    } while (lVar14 < *(int *)eps2.m_backend.data._M_elems._40_8_);
  }
  *(undefined4 *)eps2.m_backend.data._M_elems._40_8_ = uVar13;
  if (0 < *idx2) {
    lVar14 = 0;
    uVar15 = 0;
    do {
      uVar12 = (uint)uVar15;
      lVar19 = (long)(int)(vec2->m_backend).data._M_elems[lVar14];
      lVar16 = lVar19 * 0x50;
      local_4a8 = *(undefined8 *)(eps2.m_backend._72_8_ + lVar16);
      uStack_4a0 = ((undefined8 *)(eps2.m_backend._72_8_ + lVar16))[1];
      puVar1 = (undefined8 *)(eps2.m_backend._72_8_ + 0x10 + lVar16);
      local_498 = *puVar1;
      uStack_490 = puVar1[1];
      puVar1 = (undefined8 *)(eps2.m_backend._72_8_ + 0x20 + lVar16);
      local_488 = *puVar1;
      uStack_480 = puVar1[1];
      puVar1 = (undefined8 *)(eps2.m_backend._72_8_ + 0x30 + lVar16);
      local_478 = *puVar1;
      uStack_470 = puVar1[1];
      local_508.exp = *(int *)(eps2.m_backend._72_8_ + 0x40 + lVar16);
      local_508.neg = *(bool *)(eps2.m_backend._72_8_ + 0x44 + lVar16);
      local_508.data._M_elems._0_8_ = *(undefined8 *)(eps2.m_backend._72_8_ + lVar16);
      local_508.data._M_elems._8_8_ = *(undefined8 *)((uint *)(eps2.m_backend._72_8_ + lVar16) + 2);
      puVar2 = (uint *)(eps2.m_backend._72_8_ + 0x10 + lVar16);
      local_508.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      local_508.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)(eps2.m_backend._72_8_ + 0x20 + lVar16);
      local_508.data._M_elems._32_8_ = *(undefined8 *)puVar2;
      local_508.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
      puVar2 = (uint *)(eps2.m_backend._72_8_ + 0x30 + lVar16);
      local_508.data._M_elems._48_8_ = *(undefined8 *)puVar2;
      local_508.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
      local_508._72_8_ = *(undefined8 *)(eps2.m_backend._72_8_ + 0x48 + lVar16);
      local_448.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._48_8_;
      local_448.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 8);
      local_448.data._M_elems._16_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x10);
      local_448.data._M_elems._24_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x18);
      local_448.data._M_elems._32_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x20);
      local_448.data._M_elems._40_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x28);
      local_448.data._M_elems._48_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x30);
      local_448.data._M_elems._56_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x38);
      local_448.exp = *(int *)(eps2.m_backend.data._M_elems._48_8_ + 0x40);
      local_448.neg = *(bool *)(eps2.m_backend.data._M_elems._48_8_ + 0x44);
      local_448._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x48);
      if ((local_508.neg == true) &&
         (local_508.data._M_elems[0] != 0 || local_508.fpclass != cpp_dec_float_finite)) {
        local_508.neg = false;
      }
      if ((local_448.fpclass == cpp_dec_float_NaN || local_508.fpclass == cpp_dec_float_NaN) ||
         (iVar8 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            (&local_508,&local_448), iVar8 < 1)) {
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
                  ((cpp_dec_float<100U,_int,_void> *)(lVar16 + eps2.m_backend._72_8_),0);
      }
      else {
        uVar9 = piVar6[lVar19];
        uVar10 = uVar12;
        if (0 < (int)uVar12) {
          do {
            uVar18 = (uint)uVar15 - 1;
            uVar11 = uVar18 >> 1;
            uVar17 = (vec2->m_backend).data._M_elems[uVar11];
            uVar10 = (uint)uVar15;
            if ((int)uVar9 <= (int)uVar17) break;
            (vec2->m_backend).data._M_elems[uVar15] = uVar17;
            uVar15 = (ulong)uVar11;
            uVar10 = uVar11;
          } while (1 < uVar18);
        }
        uVar15 = (ulong)(uVar12 + 1);
        (vec2->m_backend).data._M_elems[(int)uVar10] = uVar9;
      }
      iVar8 = (int)uVar15;
      lVar14 = lVar14 + 1;
    } while (lVar14 < *idx2);
  }
  this_00 = local_450;
  vec_00 = local_458;
  *idx2 = iVar8;
  local_178.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_178.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_178.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_178.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_178.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_178.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
  local_178.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
  local_178.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
  local_178.m_backend.exp = (eps->m_backend).exp;
  local_178.m_backend.neg = (eps->m_backend).neg;
  local_178.m_backend.fpclass = (eps->m_backend).fpclass;
  local_178.m_backend.prec_elem = (eps->m_backend).prec_elem;
  iVar8 = vSolveUright(local_450,local_458,local_468,rhs,ridx,*rn,&local_178);
  *rn = iVar8;
  local_1c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
  local_1c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
  local_1c8.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
  local_1c8.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
  local_1c8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
  local_1c8.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
  local_1c8.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
  local_1c8.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x38);
  local_1c8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x40);
  local_1c8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x44);
  local_1c8.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x48);
  iVar8 = vSolveUright(this_00,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)eps2.m_backend.data._M_elems._8_8_,
                       (int *)eps2.m_backend.data._M_elems._16_8_,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)eps2.m_backend.data._M_elems._24_8_,
                       (int *)eps2.m_backend.data._M_elems._32_8_,
                       *(int *)eps2.m_backend.data._M_elems._40_8_,&local_1c8);
  *(int *)eps2.m_backend.data._M_elems._40_8_ = iVar8;
  local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._48_8_;
  local_218.m_backend.data._M_elems._8_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 8)
  ;
  local_218.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x10);
  local_218.m_backend.data._M_elems._24_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x18);
  local_218.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x20);
  local_218.m_backend.data._M_elems._40_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x28);
  local_218.m_backend.data._M_elems._48_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x30);
  local_218.m_backend.data._M_elems._56_8_ =
       *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x38);
  local_218.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._48_8_ + 0x40);
  local_218.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._48_8_ + 0x44);
  local_218.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x48);
  iVar8 = vSolveUright(this_00,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)eps2.m_backend.data._M_elems._56_8_,(int *)eps2.m_backend._64_8_,
                       (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)eps2.m_backend._72_8_,(int *)vec2,*idx2,&local_218);
  *idx2 = iVar8;
  if ((this_00->l).updateType == 0) {
    local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_268.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_268.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
    local_268.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc)
    ;
    local_268.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe)
    ;
    local_268.m_backend.exp = (eps->m_backend).exp;
    local_268.m_backend.neg = (eps->m_backend).neg;
    local_268.m_backend.fpclass = (eps->m_backend).fpclass;
    local_268.m_backend.prec_elem = (eps->m_backend).prec_elem;
    iVar8 = vSolveUpdateRight(this_00,vec_00,local_468,*rn,&local_268);
    *rn = iVar8;
    local_2b8.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._0_8_;
    local_2b8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 8);
    local_2b8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x10);
    local_2b8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x18);
    local_2b8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x20);
    local_2b8.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x28);
    local_2b8.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x30);
    local_2b8.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x38);
    local_2b8.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._0_8_ + 0x40);
    local_2b8.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._0_8_ + 0x44);
    local_2b8.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x48);
    iVar8 = vSolveUpdateRight(this_00,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)eps2.m_backend.data._M_elems._8_8_,
                              (int *)eps2.m_backend.data._M_elems._16_8_,
                              *(int *)eps2.m_backend.data._M_elems._40_8_,&local_2b8);
    *(int *)eps2.m_backend.data._M_elems._40_8_ = iVar8;
    local_308.m_backend.data._M_elems._0_8_ = *(undefined8 *)eps2.m_backend.data._M_elems._48_8_;
    local_308.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 8);
    local_308.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x10);
    local_308.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x18);
    local_308.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x20);
    local_308.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x28);
    local_308.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x30);
    local_308.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x38);
    local_308.m_backend.exp = *(int *)(eps2.m_backend.data._M_elems._48_8_ + 0x40);
    local_308.m_backend.neg = *(bool *)(eps2.m_backend.data._M_elems._48_8_ + 0x44);
    local_308.m_backend._72_8_ = *(undefined8 *)(eps2.m_backend.data._M_elems._48_8_ + 0x48);
    iVar8 = vSolveUpdateRight(this_00,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)eps2.m_backend.data._M_elems._56_8_,
                              (int *)eps2.m_backend._64_8_,*idx2,&local_308);
    *idx2 = iVar8;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update3sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R eps3, R* vec3, int* idx3,     /* result3 */
      R* rhs3, int* ridx3, int& rn3,     /* rhs3    */
      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright3(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2, rhs3, ridx3, rn3, eps3);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);
   assert(rn3 >= 0 && rn3 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   for(i = j = 0; i < rn3; ++i)
   {
      k = ridx3[i];
      assert(k >= 0 && k < thedim);
      x = rhs3[k];

      if(isNotZero(x, eps3))
         enQueueMax(ridx3, &j, rperm[k]);
      else
         rhs3[k] = 0;
   }

   rn3 = j;

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);
   rn3 = vSolveUright(vec3, idx3, rhs3, ridx3, rn3, eps3);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
      rn3 = vSolveUpdateRight(vec3, idx3, rn3, eps3);
   }
}